

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O0

void PAL_printf_arg_remover(va_list *ap,INT Width,INT Precision,INT Type,INT Prefix)

{
  uint uVar1;
  INT Prefix_local;
  INT Type_local;
  INT Precision_local;
  INT Width_local;
  va_list *ap_local;
  
  if ((Precision == -2) || (Precision == -4)) {
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      (*ap)[0].overflow_arg_area = (void *)((long)(*ap)[0].overflow_arg_area + 8);
    }
  }
  if ((Width == -2) || (Width == -3)) {
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      (*ap)[0].overflow_arg_area = (void *)((long)(*ap)[0].overflow_arg_area + 8);
    }
  }
  if (Type == 7) {
    uVar1 = (*ap)[0].fp_offset;
    if (uVar1 < 0xa1) {
      (*ap)[0].fp_offset = uVar1 + 0x10;
    }
    else {
      (*ap)[0].overflow_arg_area = (void *)((long)(*ap)[0].overflow_arg_area + 8);
    }
  }
  else if ((Type == 4) && (Prefix == 3)) {
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      (*ap)[0].overflow_arg_area = (void *)((long)(*ap)[0].overflow_arg_area + 8);
    }
  }
  else if ((Type == 4) || (Type == 1)) {
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      (*ap)[0].overflow_arg_area = (void *)((long)(*ap)[0].overflow_arg_area + 8);
    }
  }
  else {
    uVar1 = (*ap)[0].gp_offset;
    if (uVar1 < 0x29) {
      (*ap)[0].gp_offset = uVar1 + 8;
    }
    else {
      (*ap)[0].overflow_arg_area = (void *)((long)(*ap)[0].overflow_arg_area + 8);
    }
  }
  return;
}

Assistant:

__attribute__((no_instrument_function))
void PAL_printf_arg_remover(va_list *ap, INT Width, INT Precision, INT Type, INT Prefix)
{
    /* remove arg and precision if needed */
    if (PRECISION_STAR == Precision ||
        PRECISION_INVALID == Precision)
    {
        (void)va_arg(*ap, int);
    }
    if (WIDTH_STAR == Width ||
        WIDTH_INVALID == Width)
    {
        (void)va_arg(*ap, int);
    }
    if (Type == PFF_TYPE_FLOAT)
    {
        (void)va_arg(*ap, double);
    }
    else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_LONGLONG)
    {
        (void)va_arg(*ap, INT64);
    }
    else if (Type == PFF_TYPE_INT || Type == PFF_TYPE_CHAR)
    {
        (void)va_arg(*ap, int);
    }
    else
    {
        (void)va_arg(*ap, void *);
    }
}